

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

Union * __thiscall
kj::Arena::
allocate<capnp::compiler::NodeTranslator::StructLayout::Union,capnp::compiler::NodeTranslator::StructLayout::Group&>
          (Arena *this,Group *params)

{
  Union *location;
  Group *params_00;
  Union *result;
  Group *params_local;
  Arena *this_local;
  
  location = (Union *)allocateBytes(this,0x58,8,true);
  params_00 = fwd<capnp::compiler::NodeTranslator::StructLayout::Group&>(params);
  ctor<capnp::compiler::NodeTranslator::StructLayout::Union,capnp::compiler::NodeTranslator::StructLayout::Group&>
            (location,params_00);
  setDestructor(this,location,destroyObject<capnp::compiler::NodeTranslator::StructLayout::Union>);
  return location;
}

Assistant:

T& Arena::allocate(Params&&... params) {
  T& result = *reinterpret_cast<T*>(allocateBytes(
      sizeof(T), alignof(T), !__has_trivial_destructor(T)));
  if (!__has_trivial_constructor(T) || sizeof...(Params) > 0) {
    ctor(result, kj::fwd<Params>(params)...);
  }
  if (!__has_trivial_destructor(T)) {
    setDestructor(&result, &destroyObject<T>);
  }
  return result;
}